

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_node.h
# Opt level: O0

bool __thiscall
BufferNode<double,_long>::range_query
          (BufferNode<double,_long> *this,bool type,double lower_bound,double upper_bound,
          vector<std::pair<double,_long>,_std::allocator<std::pair<double,_long>_>_> *answers)

{
  BufferNode<double,_long> *in_RDX;
  byte in_SIL;
  BufferNode<double,_long> *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  size_t it;
  BufferNode<double,_long> *__args_1;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar2;
  undefined1 in_stack_ffffffffffffffaf;
  bool bVar3;
  double in_stack_ffffffffffffffb8;
  Buffer *in_stack_ffffffffffffffc0;
  ulong position;
  
  Buffer::range_query(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(double)in_RDI,
                      (vector<std::pair<double,_long>,_std::allocator<std::pair<double,_long>_>_> *)
                      CONCAT17(in_stack_ffffffffffffffaf,
                               CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
  position = 0;
  if ((in_SIL & 1) == 0) {
    position = find_precise_position(in_RDX,0.0);
    while( true ) {
      bVar3 = false;
      if (position < in_RDI->size) {
        dVar1 = get_key(in_RDI,position);
        bVar3 = less_than(in_RDI,dVar1,in_XMM0_Qa);
      }
      if (bVar3 == false) break;
      position = position + 1;
    }
    in_stack_ffffffffffffffaf = 0;
  }
  while( true ) {
    bVar2 = 0;
    __args_1 = in_RDX;
    if (position < in_RDI->size) {
      dVar1 = get_key(in_RDI,position);
      bVar3 = greater_than(in_RDI,dVar1,in_XMM1_Qa);
      bVar2 = bVar3 ^ 0xff;
      __args_1 = in_RDX;
    }
    if ((bVar2 & 1) == 0) break;
    in_RDX = __args_1;
    get_key(in_RDI,position);
    get_payload(in_RDI,position);
    std::vector<std::pair<double,long>,std::allocator<std::pair<double,long>>>::
    emplace_back<double,long>
              ((vector<std::pair<double,_long>,_std::allocator<std::pair<double,_long>_>_> *)in_RDI,
               (double *)
               CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(bVar2,in_stack_ffffffffffffffa8)),
               (long *)__args_1);
    position = position + 1;
  }
  return in_RDI->size <= position;
}

Assistant:

bool range_query(bool type, K lower_bound, K upper_bound, std::vector<std::pair<K, P>>& answers) const {
        buffer.range_query(lower_bound, upper_bound, answers);
        size_t it = 0;
        if (!type) {
            it = find_precise_position(lower_bound);
            while (it < size && less_than(get_key(it), lower_bound))
                ++it;
        }
        while (it < size && !greater_than(get_key(it), upper_bound)) {
            answers.emplace_back(get_key(it), get_payload(it));
            ++it;
        }
        if (it < size)
            return false;
        else
            return true;
    }